

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint ucvector_resize(ucvector *p,size_t size)

{
  uchar *puVar1;
  size_t __size;
  
  if (p->allocsize < size) {
    __size = (p->allocsize >> 1) + size;
    puVar1 = (uchar *)realloc(p->data,__size);
    if (puVar1 == (uchar *)0x0) {
      return 0;
    }
    p->allocsize = __size;
    p->data = puVar1;
  }
  p->size = size;
  return 1;
}

Assistant:

static unsigned ucvector_resize(ucvector* p, size_t size) {
  if(size > p->allocsize) {
    size_t newsize = size + (p->allocsize >> 1u);
    void* data = lodepng_realloc(p->data, newsize);
    if(data) {
      p->allocsize = newsize;
      p->data = (unsigned char*)data;
    }
    else return 0; /*error: not enough memory*/
  }
  p->size = size;
  return 1; /*success*/
}